

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::pop
          (op_queue<asio::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  scheduler_operation *psVar2;
  scheduler_operation *tmp;
  
  psVar1 = this->front_;
  if (psVar1 != (scheduler_operation *)0x0) {
    psVar2 = psVar1->next_;
    this->front_ = psVar2;
    if (psVar2 == (scheduler_operation *)0x0) {
      this->back_ = (scheduler_operation *)0x0;
    }
    psVar1->next_ = (scheduler_operation *)0x0;
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }